

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNodeSetContentInternal(xmlNodePtr cur,xmlChar *content,int len)

{
  xmlElementType xVar1;
  int iVar2;
  xmlChar *local_30;
  xmlChar *copy;
  int len_local;
  xmlChar *content_local;
  xmlNodePtr cur_local;
  
  if (cur == (xmlNodePtr)0x0) {
    return 1;
  }
  xVar1 = cur->type;
  if (1 < xVar1 - XML_ELEMENT_NODE) {
    if ((xVar1 - XML_TEXT_NODE < 2) || (xVar1 - XML_PI_NODE < 2)) {
      local_30 = (xmlChar *)0x0;
      if (content != (xmlChar *)0x0) {
        if (len < 0) {
          local_30 = xmlStrdup(content);
        }
        else {
          local_30 = xmlStrndup(content,len);
        }
        if (local_30 == (xmlChar *)0x0) {
          return -1;
        }
      }
      xmlTextSetContent(cur,local_30);
      return 0;
    }
    if (xVar1 != XML_DOCUMENT_FRAG_NODE) {
      return 0;
    }
  }
  iVar2 = xmlNodeParseContent(cur,content,len);
  if (-1 < iVar2) {
    return 0;
  }
  return -1;
}

Assistant:

static int
xmlNodeSetContentInternal(xmlNodePtr cur, const xmlChar *content, int len) {
    if (cur == NULL) {
	return(1);
    }
    switch (cur->type) {
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
            if (xmlNodeParseContent(cur, content, len) < 0)
                return(-1);
	    break;

        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE: {
            xmlChar *copy = NULL;

	    if (content != NULL) {
                if (len < 0)
                    copy = xmlStrdup(content);
                else
		    copy = xmlStrndup(content, len);
                if (copy == NULL)
                    return(-1);
	    }

            xmlTextSetContent(cur, copy);
	    break;
        }

        default:
            break;
    }

    return(0);
}